

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

string * __thiscall
Assimp::B3DImporter::ReadString_abi_cxx11_(string *__return_storage_ptr__,B3DImporter *this)

{
  uint uVar1;
  int iVar2;
  size_type sVar3;
  allocator local_71;
  string local_70;
  char local_39;
  string local_38 [7];
  char c;
  string str;
  B3DImporter *this_local;
  
  str.field_2._8_8_ = this;
  std::__cxx11::string::string(local_38);
  while( true ) {
    uVar1 = this->_pos;
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_buf);
    if (sVar3 <= uVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_70,"EOF",&local_71);
      Fail(this,&local_70);
    }
    iVar2 = ReadByte(this);
    local_39 = (char)iVar2;
    if (local_39 == '\0') break;
    std::__cxx11::string::operator+=(local_38,local_39);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_38);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

string B3DImporter::ReadString(){
    string str;
    while( _pos<_buf.size() ){
        char c=(char)ReadByte();
        if( !c ) return str;
        str+=c;
    }
    Fail( "EOF" );
    return string();
}